

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfSetBlock(int64_t MshIdx,int KwdCod,int64_t BegIdx,int64_t EndIdx,int MapTyp,void *MapTab,
               void *prc,...)

{
  long *plVar1;
  char in_AL;
  int iVar2;
  long lVar3;
  uint *puVar4;
  char *pcVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  code *in_stack_00000008;
  undefined8 in_stack_00000010;
  char *UsrArg;
  aiocb aio;
  KwdSct *kwd;
  GmfMshSct *msh;
  va_list VarArg;
  size_t NmbBlk;
  size_t b;
  size_t s;
  size_t VecLen;
  size_t LinSiz;
  size_t ret;
  size_t UsrLen [1000];
  _func_void_int64_t_int64_t_void_ptr *UsrPrc;
  size_t FilEndIdx;
  size_t FilBegIdx;
  int64_t OldIdx;
  int64_t *LngMapTab;
  int64_t *UsrPtrI64;
  int64_t *FilPtrI64;
  int64_t BlkEndIdx;
  int64_t BlkBegIdx;
  int64_t BlkNmbLin;
  int64_t UsrNmbLin;
  double *UsrPtrR64;
  double *FilPtrR64;
  float *UsrPtrR32;
  float *FilPtrR32;
  int ArgCnt;
  int VecCnt;
  int TotSiz;
  int IniFlg;
  int *SizTab;
  int *TypTab;
  int mod;
  int typ;
  int *IntMapTab;
  int err;
  int TypSiz [4];
  int UsrTyp [1000];
  int FilTyp [1000];
  int *UsrPtrI32;
  int *FilPtrI32;
  int j;
  int i;
  char *EndUsrDat;
  char *BegUsrDat;
  char **EndTab;
  char **BegTab;
  char *BckBuf;
  char *FrtBuf;
  char *FilBuf;
  char *FilPos;
  char *StrTab [4];
  char *UsrBas [1000];
  char *UsrDat [1000];
  long *in_stack_ffffffffffff7f58;
  GmfMshSct *in_stack_ffffffffffff7f60;
  long *local_8090;
  long *local_8078;
  long *local_8060;
  long local_7fb8 [6];
  undefined4 local_7f88;
  undefined8 local_7f78;
  undefined8 local_7f68;
  undefined8 local_7f58;
  undefined8 local_7f48;
  undefined8 local_7f38;
  undefined8 local_7f28;
  undefined8 local_7f18;
  undefined8 local_7f08;
  aiocb local_7f00;
  int *local_7ed8;
  long local_7ed0;
  undefined1 local_7ec8 [16];
  long *local_7eb8;
  ulong local_7ea8;
  ulong local_7ea0;
  ulong local_7e98;
  ulong local_7e90;
  size_t local_7e88;
  size_t local_7e80;
  ulong auStack_7e78 [1000];
  code *local_5f38;
  ulong local_5f30;
  ulong local_5f28;
  long local_5f20;
  long local_5f18;
  double *local_5f10;
  double *local_5f08;
  long local_5f00;
  long local_5ef8;
  long local_5ef0;
  ulong local_5ee8;
  double *local_5ee0;
  double *local_5ed8;
  float *local_5ed0;
  double *local_5ec8;
  int local_5ec0;
  int local_5ebc;
  int local_5eb8;
  int local_5eb4;
  long local_5eb0;
  long local_5ea8;
  int local_5ea0;
  int local_5e9c;
  long local_5e98;
  int local_5e8c;
  int local_5e88 [2];
  char local_5e80 [8];
  int aiStack_5e78 [1000];
  int aiStack_4ed8 [1002];
  float *local_3f30;
  double *local_3f28;
  int local_3f20;
  int local_3f1c;
  long local_3f18;
  long local_3f10;
  long local_3f08;
  long local_3f00;
  double *local_3ef8;
  double *local_3ef0;
  double *local_3ee8;
  double *local_3ee0;
  char *local_3ed8 [4];
  long alStack_3eb8 [1000];
  long alStack_1f78 [1000];
  long local_38;
  int local_2c;
  char local_28 [8];
  char local_20 [12];
  int local_14;
  long local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_7f88 = in_XMM0_Da;
    local_7f78 = in_XMM1_Qa;
    local_7f68 = in_XMM2_Qa;
    local_7f58 = in_XMM3_Qa;
    local_7f48 = in_XMM4_Qa;
    local_7f38 = in_XMM5_Qa;
    local_7f28 = in_XMM6_Qa;
    local_7f18 = in_XMM7_Qa;
  }
  local_3ed8[0] = "%.9g";
  local_3ed8[1] = "%.17g";
  local_3ed8[2] = "%d";
  local_3ed8[3] = "%lld";
  local_3ee8 = (double *)0x0;
  local_3ef0 = (double *)0x0;
  local_3ef8 = (double *)0x0;
  local_5e88 = (int  [2])0x800000004;
  local_5e80[0] = '\x04';
  local_5e80[1] = '\0';
  local_5e80[2] = '\0';
  local_5e80[3] = '\0';
  local_5e80[4] = '\b';
  local_5e80[5] = '\0';
  local_5e80[6] = '\0';
  local_5e80[7] = '\0';
  local_5e98 = 0;
  local_5ea0 = 0x65;
  local_5eb4 = 1;
  local_5eb8 = 0;
  local_5ec0 = 0;
  local_5ef0 = 0;
  local_5f00 = 0;
  local_5f18 = 0;
  local_5f20 = 0;
  local_5f38 = (code *)0x0;
  local_7ed8 = (int *)(in_RDI + 0x110 + (long)in_ESI * 0x3300);
  local_7f08 = 0;
  local_7ed0 = in_RDI;
  local_5f30 = in_RCX;
  local_5f28 = in_RDX;
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = (char  [8])in_RCX;
  local_20._0_8_ = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_5e8c = _setjmp((__jmp_buf_tag *)(in_RDI + 0x48));
  if (local_5e8c == 0) {
    if (((local_14 < 1) || (0xf0 < local_14)) || (*(long *)(local_7ed8 + 0x3f2) == 0)) {
      local_4 = 0;
    }
    else if ((*local_7ed8 == 2) || (*local_7ed8 == 3)) {
      local_5f30 = *(ulong *)(local_7ed8 + 0x3f2);
      if ((local_5f30 == 0) || (*(ulong *)(local_7ed8 + 0x3f2) < local_5f30)) {
        local_4 = 0;
      }
      else {
        if (local_2c == 10) {
          local_5e98 = local_38;
        }
        else if (local_2c == 0xb) {
          local_5f18 = local_38;
        }
        local_7eb8 = local_7fb8;
        local_7ec8._8_8_ = &stack0x00000010;
        if (in_stack_00000008 != (code *)0x0) {
          local_7ec8._8_8_ = &stack0x00000018;
          local_5f38 = in_stack_00000008;
          local_7f08 = in_stack_00000010;
        }
        local_5f28 = 1;
        local_7e88 = 0;
        local_7ec8._4_4_ = 0x30;
        local_7ec8._0_4_ = 0x30;
        local_5ee8 = local_5f30;
        if ((*local_7ed8 != 2) && (*local_7ed8 != 3)) {
          longjmp((__jmp_buf_tag *)(local_7ed0 + 0x48),-0x2a);
        }
        local_5e9c = *(int *)local_7ec8._8_8_;
        plVar1 = (long *)(local_7ec8._8_8_ + 8);
        if (local_5e9c == 100) {
          local_5ea0 = 100;
          local_5ea8 = *(long *)(local_7ec8._8_8_ + 8);
          local_5eb0 = *(long *)(local_7ec8._8_8_ + 0x10);
          local_3f00 = *(long *)(local_7ec8._8_8_ + 0x18);
          local_3f08 = *(long *)(local_7ec8._8_8_ + 0x20);
          plVar1 = (long *)(local_7ec8._8_8_ + 0x28);
        }
        local_7ec8._8_8_ = plVar1;
        local_7ec8._0_4_ = 0x30;
        while (local_5eb8 < local_7ed8[3]) {
          if (local_5ea0 == 0x65) {
            if (local_5eb4 == 0) {
              if ((uint)local_7ec8._0_4_ < 0x29) {
                local_8060 = (long *)((long)local_7eb8 + (long)(int)local_7ec8._0_4_);
                local_7ec8._0_4_ = local_7ec8._0_4_ + 8;
              }
              else {
                local_8060 = (long *)local_7ec8._8_8_;
                local_7ec8._8_8_ = local_7ec8._8_8_ + 8;
              }
              local_5e9c = (int)*local_8060;
            }
            else {
              local_5eb4 = 0;
            }
            if ((local_5e9c < 0xc) || (0xf < local_5e9c)) {
              if ((local_5e9c < 1) || (4 < local_5e9c)) {
                local_5ebc = 1;
              }
              else {
                local_5ebc = *(int *)(local_7ed0 + 0x1c + (long)local_5e9c * 4);
                local_5e9c = 9;
                if (*(int *)(local_7ed0 + 4) == 1) {
                  local_5e9c = 8;
                }
              }
            }
            else {
              local_5e9c = local_5e9c + -4;
              if ((uint)local_7ec8._0_4_ < 0x29) {
                local_8078 = (long *)((long)local_7eb8 + (long)(int)local_7ec8._0_4_);
                local_7ec8._0_4_ = local_7ec8._0_4_ + 8;
              }
              else {
                local_8078 = (long *)local_7ec8._8_8_;
                local_7ec8._8_8_ = local_7ec8._8_8_ + 8;
              }
              local_5ebc = (int)*local_8078;
            }
            if ((uint)local_7ec8._0_4_ < 0x29) {
              local_8090 = (long *)((long)local_7eb8 + (long)(int)local_7ec8._0_4_);
              local_7ec8._0_4_ = local_7ec8._0_4_ + 8;
            }
            else {
              local_8090 = (long *)local_7ec8._8_8_;
              local_7ec8._8_8_ = local_7ec8._8_8_ + 8;
            }
            local_3f10 = *local_8090;
            in_stack_ffffffffffff7f60 = (GmfMshSct *)local_7ec8;
            if ((uint)local_7ec8._0_4_ < 0x29) {
              lVar3 = (long)(int)local_7ec8._0_4_;
              local_7ec8._0_4_ = local_7ec8._0_4_ + 8;
              in_stack_ffffffffffff7f58 = (long *)((long)local_7eb8 + lVar3);
            }
            else {
              in_stack_ffffffffffff7f58 = (long *)local_7ec8._8_8_;
              local_7ec8._8_8_ = (long *)(local_7ec8._8_8_ + 8);
            }
            local_3f18 = *in_stack_ffffffffffff7f58;
          }
          else {
            local_5e9c = *(int *)(local_5ea8 + (long)local_5ec0 * 4);
            if ((local_5e9c < 0xc) || (0xf < local_5e9c)) {
              if ((local_5e9c < 1) || (4 < local_5e9c)) {
                local_5ebc = 1;
              }
              else {
                local_5ebc = *(int *)(local_7ed0 + 0x1c + (long)local_5e9c * 4);
                local_5e9c = 9;
                if (*(int *)(local_7ed0 + 4) == 1) {
                  local_5e9c = 8;
                }
              }
            }
            else {
              local_5e9c = local_5e9c + -4;
              local_5ebc = *(int *)(local_5eb0 + (long)local_5ec0 * 4);
            }
            local_3f10 = *(long *)(local_3f00 + (long)local_5ec0 * 8);
            local_3f18 = *(long *)(local_3f08 + (long)local_5ec0 * 8);
            local_5ec0 = local_5ec0 + 1;
          }
          if ((long)local_5f30 < 2) {
            local_7e90 = 0;
          }
          else {
            local_7e90 = (ulong)(local_3f18 - local_3f10) / (local_5f30 - 1);
          }
          for (local_3f1c = 0; local_3f1c < local_5ebc; local_3f1c = local_3f1c + 1) {
            aiStack_5e78[local_5eb8] = local_5e9c;
            alStack_3eb8[local_5eb8] = local_3f10 + local_3f1c * local_5e88[local_5e9c + -8];
            alStack_1f78[local_5eb8] = alStack_3eb8[local_5eb8];
            auStack_7e78[local_5eb8] = local_7e90;
            local_5eb8 = local_5eb8 + 1;
          }
        }
        for (local_3f1c = 0; local_3f1c < local_7ed8[3]; local_3f1c = local_3f1c + 1) {
          if (*(char *)((long)local_7ed8 + (long)local_3f1c + 0xfd8) == 'r') {
            if (*(int *)(local_7ed0 + 0x18) == 0x20) {
              aiStack_4ed8[local_3f1c] = 8;
            }
            else {
              aiStack_4ed8[local_3f1c] = 9;
            }
          }
          else if (*(int *)(local_7ed0 + 4) < 4) {
            aiStack_4ed8[local_3f1c] = 10;
          }
          else {
            aiStack_4ed8[local_3f1c] = 0xb;
          }
          local_7e88 = (long)local_5e88[aiStack_4ed8[local_3f1c] + -8] + local_7e88;
        }
        if ((*(uint *)(local_7ed0 + 0xc) & 1) == 0) {
          local_3ef8 = (double *)malloc(local_7e88 * 10000);
          if (local_3ef8 == (double *)0x0) {
            longjmp((__jmp_buf_tag *)(local_7ed0 + 0x48),-0x2b);
          }
          local_3ef0 = (double *)malloc(local_7e88 * 10000);
          if (local_3ef0 == (double *)0x0) {
            longjmp((__jmp_buf_tag *)(local_7ed0 + 0x48),-0x2c);
          }
          memset(&local_7f00,0,0x28);
          local_3ee8 = local_3ef8;
          local_7f00.aio_fildes = *(FILE **)(local_7ed0 + 0x300410);
          local_7f00.aio_offset = GetFilPos((GmfMshSct *)0x10e226);
          local_7ea8 = (long)local_5ee8 / 10000;
          for (local_7ea0 = 0; local_7ea0 <= local_7ea8 + 1; local_7ea0 = local_7ea0 + 1) {
            if (local_7ea0 != 0) {
              local_7f00.aio_nbytes = local_5ef0 * local_7e88;
              iVar2 = my_aio_write((aiocb *)0x10e2a6);
              if (iVar2 == -1) {
                printf("aio_fildes = %p\n",local_7f00.aio_fildes);
                printf("aio_buf    = %p\n",local_7f00.aio_buf);
                printf("aio_offset = %ld\n",local_7f00.aio_offset);
                printf("aio_nbytes = %ld\n",local_7f00.aio_nbytes);
                puVar4 = (uint *)__errno_location();
                printf("errno      = %d\n",(ulong)*puVar4);
                longjmp((__jmp_buf_tag *)(local_7ed0 + 0x48),-0x2d);
              }
            }
            if (local_7ea0 <= local_7ea8) {
              if (local_7ea0 == local_7ea8) {
                local_5ef0 = local_5ee8 + local_7ea0 * -10000;
              }
              else {
                local_5ef0 = 10000;
              }
              local_3ee0 = local_3ee8;
              local_5ef8 = local_5f00 + 1;
              local_5f00 = local_5ef0 + local_5f00;
              if (local_5f38 != (code *)0x0) {
                (*local_5f38)(local_5ef8,local_5f00,local_7f08);
              }
              for (local_3f1c = 0; local_3f1c < local_5ef0; local_3f1c = local_3f1c + 1) {
                lVar3 = local_5f20 + 1;
                for (local_3f20 = 0; local_3f20 < local_7ed8[3]; local_3f20 = local_3f20 + 1) {
                  if (local_5e98 == 0) {
                    if (local_5f18 == 0) {
                      alStack_1f78[local_3f20] =
                           alStack_3eb8[local_3f20] + local_5f20 * auStack_7e78[local_3f20];
                    }
                    else {
                      alStack_1f78[local_3f20] =
                           alStack_3eb8[local_3f20] +
                           (*(long *)(local_5f18 + lVar3 * 8) + -1) * auStack_7e78[local_3f20];
                    }
                  }
                  else {
                    alStack_1f78[local_3f20] =
                         alStack_3eb8[local_3f20] +
                         (long)(*(int *)(local_5e98 + lVar3 * 4) + -1) * auStack_7e78[local_3f20];
                  }
                  if (aiStack_4ed8[local_3f20] == 10) {
                    local_3f28 = local_3ee0;
                    if (aiStack_5e78[local_3f20] == 10) {
                      local_3f30 = (float *)alStack_1f78[local_3f20];
                      *(float *)local_3ee0 = *(float *)alStack_1f78[local_3f20];
                    }
                    else {
                      local_5f10 = (double *)alStack_1f78[local_3f20];
                      *(float *)local_3ee0 = SUB84(*local_5f10,0);
                    }
                  }
                  else if (aiStack_4ed8[local_3f20] == 0xb) {
                    local_5f08 = local_3ee0;
                    if (aiStack_5e78[local_3f20] == 0xb) {
                      local_5f10 = (double *)alStack_1f78[local_3f20];
                      *local_3ee0 = *local_5f10;
                    }
                    else {
                      local_3f30 = (float *)alStack_1f78[local_3f20];
                      *local_3ee0 = (double)(long)(int)*(float *)alStack_1f78[local_3f20];
                    }
                  }
                  else if (aiStack_4ed8[local_3f20] == 8) {
                    local_5ec8 = local_3ee0;
                    if (aiStack_5e78[local_3f20] == 8) {
                      local_5ed0 = (float *)alStack_1f78[local_3f20];
                      *(float *)local_3ee0 = *local_5ed0;
                    }
                    else {
                      local_5ee0 = (double *)alStack_1f78[local_3f20];
                      *(float *)local_3ee0 = (float)*local_5ee0;
                    }
                  }
                  else if (aiStack_4ed8[local_3f20] == 9) {
                    local_5ed8 = local_3ee0;
                    if (aiStack_5e78[local_3f20] == 9) {
                      local_5ee0 = (double *)alStack_1f78[local_3f20];
                      *local_3ee0 = *local_5ee0;
                    }
                    else {
                      local_5ed0 = (float *)alStack_1f78[local_3f20];
                      *local_3ee0 = (double)*local_5ed0;
                    }
                  }
                  local_3ee0 = (double *)
                               ((long)local_3ee0 + (long)local_5e88[aiStack_4ed8[local_3f20] + -8]);
                }
                local_5f20 = lVar3;
              }
            }
            if (local_7ea0 != 0) {
              do {
                iVar2 = my_aio_error(&local_7f00);
              } while (iVar2 == 0x73);
              local_5e8c = my_aio_error(&local_7f00);
              local_7e80 = my_aio_return(&local_7f00);
              if (local_5e8c != 0) {
                pcVar5 = strerror(local_5e8c);
                printf(" Error at aio_error() : %s\n",pcVar5);
                longjmp((__jmp_buf_tag *)(local_7ed0 + 0x48),-0x2e);
              }
              if (local_7e80 != local_7f00.aio_nbytes) {
                printf(" Error at aio_return()\n");
                longjmp((__jmp_buf_tag *)(local_7ed0 + 0x48),-0x2f);
              }
              local_7f00.aio_offset = local_7f00.aio_nbytes + local_7f00.aio_offset;
            }
            if (local_3ee8 == local_3ef8) {
              local_7f00.aio_buf = local_3ef8;
              local_3ee8 = local_3ef0;
            }
            else {
              local_7f00.aio_buf = local_3ef0;
              local_3ee8 = local_3ef8;
            }
          }
          SetFilPos(in_stack_ffffffffffff7f60,(int64_t)in_stack_ffffffffffff7f58);
          free(local_3ef8);
          free(local_3ef0);
        }
        else {
          if (local_5f38 != (code *)0x0) {
            (*local_5f38)(1,*(undefined8 *)(local_7ed8 + 0x3f2),local_7f08);
          }
          for (local_7e98 = local_5f28; local_7e98 <= local_5f30; local_7e98 = local_7e98 + 1) {
            for (local_3f20 = 0; local_3f20 < local_7ed8[3]; local_3f20 = local_3f20 + 1) {
              if (aiStack_5e78[local_3f20] == 8) {
                local_5ed0 = (float *)alStack_1f78[local_3f20];
                fprintf(*(FILE **)(local_7ed0 + 0x300410),local_3ed8[aiStack_5e78[local_3f20] + -8],
                        SUB84((double)*local_5ed0,0));
              }
              else if (aiStack_5e78[local_3f20] == 9) {
                local_5ee0 = (double *)alStack_1f78[local_3f20];
                fprintf(*(FILE **)(local_7ed0 + 0x300410),local_3ed8[aiStack_5e78[local_3f20] + -8],
                        SUB84(*local_5ee0,0));
              }
              else if (aiStack_5e78[local_3f20] == 10) {
                local_3f30 = (float *)alStack_1f78[local_3f20];
                fprintf(*(FILE **)(local_7ed0 + 0x300410),local_3ed8[aiStack_5e78[local_3f20] + -8],
                        (ulong)(uint)*(float *)alStack_1f78[local_3f20]);
              }
              else if (aiStack_5e78[local_3f20] == 0xb) {
                local_5f10 = (double *)alStack_1f78[local_3f20];
                fprintf(*(FILE **)(local_7ed0 + 0x300410),local_3ed8[aiStack_5e78[local_3f20] + -8],
                        *local_5f10);
              }
              if (local_3f20 < local_7ed8[3] + -1) {
                fprintf(*(FILE **)(local_7ed0 + 0x300410)," ");
              }
              else {
                fprintf(*(FILE **)(local_7ed0 + 0x300410),"\n");
              }
              if (local_5e98 == 0) {
                if (local_5f18 == 0) {
                  alStack_1f78[local_3f20] =
                       alStack_3eb8[local_3f20] + local_7e98 * auStack_7e78[local_3f20];
                }
                else {
                  alStack_1f78[local_3f20] =
                       alStack_3eb8[local_3f20] +
                       *(long *)(local_5f18 + local_7e98 * 8) * auStack_7e78[local_3f20];
                }
              }
              else {
                alStack_1f78[local_3f20] =
                     alStack_3eb8[local_3f20] +
                     (long)*(int *)(local_5e98 + local_7e98 * 4) * auStack_7e78[local_3f20];
              }
            }
          }
        }
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    if (local_3ee8 != (double *)0x0) {
      free(local_3ee8);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int GmfSetBlock(  int64_t MshIdx, int KwdCod, int64_t BegIdx, int64_t EndIdx,
                  int MapTyp, void *MapTab, void *prc, ... )
{
   char        *UsrDat[ GmfMaxTyp ], *UsrBas[ GmfMaxTyp ];
   char        *StrTab[4] = {"%.9g", "%.17g", "%d", "%lld" }, *FilPos;
   char        *FilBuf = NULL, *FrtBuf = NULL, *BckBuf = NULL;
   char        **BegTab, **EndTab, *BegUsrDat, *EndUsrDat;
   int         i, j, *FilPtrI32, *UsrPtrI32, FilTyp[ GmfMaxTyp ];
   int         UsrTyp[ GmfMaxTyp ], TypSiz[4] = {4,8,4,8};
   int         err, *IntMapTab = NULL, typ, mod = GmfArgLst;
   int         *TypTab, *SizTab, IniFlg = 1, TotSiz = 0, VecCnt, ArgCnt = 0;
   float       *FilPtrR32, *UsrPtrR32;
   double      *FilPtrR64, *UsrPtrR64;
   int64_t     UsrNmbLin, BlkNmbLin = 0, BlkBegIdx, BlkEndIdx = 0;
   int64_t     *FilPtrI64, *UsrPtrI64, *LngMapTab = NULL, OldIdx = 0;
   size_t      FilBegIdx = BegIdx, FilEndIdx = EndIdx;
   void        (*UsrPrc)(int64_t, int64_t, void *) = NULL;
   size_t      UsrLen[ GmfMaxTyp ], ret, LinSiz, VecLen, s, b, NmbBlk;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];
   struct      aiocb aio;
   char        *UsrArg = NULL;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(FilBuf)
         free(FilBuf);

      return(0);
   }

   // Check mesh and keyword
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) || !kwd->NmbLin )
      return(0);

   // Make sure it's not a simple information keyword
   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      return(0);

   // Temporarily overwright the given begin and end values
   // as arbitrary position block write is not yet implemented
   FilBegIdx = 1;
   FilEndIdx = kwd->NmbLin;

   // Check user's bounds
   if( (FilBegIdx < 1) || (FilBegIdx > FilEndIdx) || (FilEndIdx > (size_t)kwd->NmbLin) )
      return(0);

   // Compute the number of lines to be written
   UsrNmbLin = FilEndIdx - FilBegIdx + 1;

   // Get the renumbering map if any
   if(MapTyp == GmfInt)
      IntMapTab = (int *)MapTab;
   else if(MapTyp == GmfLong)
      LngMapTab = (int64_t *)MapTab;

   // Start decoding the arguments
   va_start(VarArg, prc);
   LinSiz = 0;

   // Get the user's postprocessing procedure and argument adresses, if any
   if(prc)
   {
      UsrPrc = (void (*)(int64_t, int64_t, void *))prc;
      UsrArg = va_arg(VarArg, void *);
   }

   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      longjmp(msh->err, -42);

   // Read the first data type to select between list and table mode
   typ = va_arg(VarArg, int);

   // If the table mode is selected, read the four additional tables
   // containing the arguments: type, vector size, begin and end pointers
   if(typ == GmfArgTab)
   {
      mod = GmfArgTab;
      TypTab = va_arg(VarArg, int *);
      SizTab = va_arg(VarArg, int *);
      BegTab = va_arg(VarArg, char **);
      EndTab = va_arg(VarArg, char **);
   }

   // Read the arguments until to total size reaches the keyword's size
   while(TotSiz < kwd->SolSiz)
   {
      // In list mode all arguments are read from the variable argument buffer
      if(mod == GmfArgLst)
      {
         // Do not read the type argument for the first iteration because
         // it was read befeore the loop begins to get the argument mode
         if(IniFlg)
            IniFlg = 0;
         else
            typ = va_arg(VarArg, int);

         // In case the type is a vector. get its size and change the type
         // for the corresponding scalar type
         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = va_arg(VarArg, int);
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            //  to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = va_arg(VarArg, char *);
         EndUsrDat = va_arg(VarArg, char *);
      }
      else
      {
         // Do exactly the same as above but the arguments are read from
         // the tables instead of VarArgs
         typ = TypTab[ ArgCnt ];

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = SizTab[ ArgCnt ];
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            // to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = (char *)BegTab[ ArgCnt ];
         EndUsrDat = (char *)EndTab[ ArgCnt ];
         ArgCnt++;
      }

      if(UsrNmbLin > 1)
      {
         VecLen = EndUsrDat - BegUsrDat;
         VecLen /= UsrNmbLin - 1;
      }
      else
         VecLen = 0;

      // Compute the consecutive begin / end adresses for vector data types
      for(i=0;i<VecCnt;i++)
      {
         UsrTyp[ TotSiz ]  = typ;
         UsrBas[ TotSiz ]  = BegUsrDat + i * TypSiz[ typ - GmfFloat ];
         UsrDat[ TotSiz ]  = UsrBas[ TotSiz ];
         UsrLen[ TotSiz ]  = VecLen;
         TotSiz++;
      }
   }

   // Get the file's data type
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
         if(msh->FltSiz == 32)
            FilTyp[i] = GmfFloat;
         else
            FilTyp[i] = GmfDouble;
      else
         if(msh->ver <= 3)
            FilTyp[i] = GmfInt;
         else
            FilTyp[i] = GmfLong;

      // Compute the file stride
      LinSiz += TypSiz[ FilTyp[i] - GmfFloat ];
   }

   va_end(VarArg);

   // Write the whole kwd data
   if(msh->typ & Asc)
   {
      if(UsrPrc)
         UsrPrc(1, kwd->NmbLin, UsrArg);

      for(s=FilBegIdx; s<=FilEndIdx; s++)
         for(j=0;j<kwd->SolSiz;j++)
         {
            if(UsrTyp[j] == GmfFloat)
            {
               UsrPtrR32 = (float *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], (double)*UsrPtrR32);
            }
            else if(UsrTyp[j] == GmfDouble)
            {
               UsrPtrR64 = (double *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrR64);
            }
            else if(UsrTyp[j] == GmfInt)
            {
               UsrPtrI32 = (int *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrI32);
            }
            else if(UsrTyp[j] == GmfLong)
            {
               UsrPtrI64 = (int64_t *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrI64);
            }

            if(j < kwd->SolSiz -1)
               fprintf(msh->hdl, " ");
            else
               fprintf(msh->hdl, "\n");

            //UsrDat[j] += UsrLen[j];
            if(IntMapTab)
               UsrDat[j] = UsrBas[j] + IntMapTab[s] * UsrLen[j];
            else if(LngMapTab)
               UsrDat[j] = UsrBas[j] + LngMapTab[s] * UsrLen[j];
            else
               UsrDat[j] = UsrBas[j] + s * UsrLen[j];
         }
   }
   else
   {
      // Allocate the front and back buffers
      if(!(BckBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -43);

      if(!(FrtBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -44);

      // Setup the asynchronous parameters
      memset(&aio, 0, sizeof(struct aiocb));
      FilBuf = BckBuf;
#ifdef WITH_GMF_AIO
      aio.aio_fildes = msh->FilDes;
#else
      aio.aio_fildes = msh->hdl;
#endif
      aio.aio_offset = (size_t)GetFilPos(msh);

      NmbBlk = UsrNmbLin / BufSiz;

      // Loop over N+1 blocks
      for(b=0;b<=NmbBlk+1;b++)
      {
         // Launch an asynchronous block write
         // except for the first loop iteration
         if(b)
         {
            aio.aio_nbytes = BlkNmbLin * LinSiz;
            
            if(my_aio_write(&aio) == -1)
            {
#ifdef WITH_GMF_AIO
               printf("aio_fildes = %d\n",aio.aio_fildes);
#else
               printf("aio_fildes = %p\n",aio.aio_fildes);
#endif
               printf("aio_buf    = %p\n",aio.aio_buf);
               printf("aio_offset = " INT64_T_FMT "\n",(int64_t)aio.aio_offset);
               printf("aio_nbytes = " INT64_T_FMT "\n",(int64_t)aio.aio_nbytes);
               printf("errno      = %d\n",errno);
               longjmp(msh->err, -45);
            }
         }

         // Parse the block data except at the last loop iteration
         if(b<=NmbBlk)
         {
            // The last block is shorter
            if(b == NmbBlk)
               BlkNmbLin = UsrNmbLin - b * BufSiz;
            else
               BlkNmbLin = BufSiz;

            FilPos = FilBuf;
            BlkBegIdx = BlkEndIdx+1;
            BlkEndIdx += BlkNmbLin;

            // Call user's preprocessing first
            if(UsrPrc)
               UsrPrc(BlkBegIdx, BlkEndIdx, UsrArg);

            // Then copy it's data to the file buffer
            for(i=0;i<BlkNmbLin;i++)
            {
               OldIdx++;

               for(j=0;j<kwd->SolSiz;j++)
               {
                  if(IntMapTab)
                     UsrDat[j] = UsrBas[j] + (IntMapTab[ OldIdx ] - 1) * UsrLen[j];
                  else if(LngMapTab)
                     UsrDat[j] = UsrBas[j] + (LngMapTab[ OldIdx ] - 1) * UsrLen[j];
                  else
                     UsrDat[j] = UsrBas[j] + (OldIdx - 1) * UsrLen[j];

                  if(FilTyp[j] == GmfInt)
                  {
                     FilPtrI32 = (int *)FilPos;

                     if(UsrTyp[j] == GmfInt)
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *FilPtrI32 = *UsrPtrI32;
                     }
                     else
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *FilPtrI32 = (int)*UsrPtrI64;
                     }
                  }
                  else if(FilTyp[j] == GmfLong)
                  {
                     FilPtrI64 = (int64_t *)FilPos;

                     if(UsrTyp[j] == GmfLong)
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *FilPtrI64 = *UsrPtrI64;
                     }
                     else
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *FilPtrI64 = (int64_t)*UsrPtrI32;
                     }
                  }
                  else if(FilTyp[j] == GmfFloat)
                  {
                     FilPtrR32 = (float *)FilPos;

                     if(UsrTyp[j] == GmfFloat)
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *FilPtrR32 = *UsrPtrR32;
                     }
                     else
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *FilPtrR32 = (float)*UsrPtrR64;
                     }
                  }
                  else if(FilTyp[j] == GmfDouble)
                  {
                     FilPtrR64 = (double *)FilPos;

                     if(UsrTyp[j] == GmfDouble)
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *FilPtrR64 = *UsrPtrR64;
                     }
                     else
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *FilPtrR64 = (double)*UsrPtrR32;
                     }
                  }

                  FilPos += TypSiz[ FilTyp[j] - GmfFloat ];
               }
            }
         }

         // Wait for write completion execpt at the first loop iteration
         if(b)
         {
            while(my_aio_error(&aio) == EINPROGRESS);

            err = my_aio_error(&aio);
            ret = my_aio_return(&aio);

            if (err != 0) {
              printf (" Error at aio_error() : %s\n", strerror (err));
              longjmp(msh->err, -46);
            }

            if (ret != aio.aio_nbytes) {
              printf(" Error at aio_return()\n");
              longjmp(msh->err, -47);
            }

            // Move the write position
            aio.aio_offset += (size_t)aio.aio_nbytes;
         }

         // Swap the buffers
         if(FilBuf == BckBuf)
         {
            aio.aio_buf = BckBuf;
            FilBuf = FrtBuf;
         }
         else
         {
            aio.aio_buf = FrtBuf;
            FilBuf = BckBuf;
         }
      }

      SetFilPos(msh, aio.aio_offset);
      free(BckBuf);
      free(FrtBuf);
   }

   return(1);
}